

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfcn.cpp
# Opt level: O1

void qsort_descent_inplace(vector<Object,_std::allocator<Object>_> *objects,int left,int right)

{
  float fVar1;
  pointer pOVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int *piVar8;
  int iVar9;
  pointer pOVar10;
  pointer pOVar11;
  long lVar12;
  int right_00;
  int iVar13;
  int *piVar14;
  long lVar15;
  
  do {
    right_00 = right;
    iVar13 = left;
    if (left <= right) {
      fVar1 = (objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
              super__Vector_impl_data._M_start[(right + left) / 2].prob;
      do {
        pOVar2 = (objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar12 = (long)iVar13 + -1;
        pOVar11 = pOVar2 + (long)iVar13 + -1;
        iVar9 = iVar13;
        do {
          iVar13 = iVar9;
          pOVar10 = pOVar11;
          lVar12 = lVar12 + 1;
          pOVar11 = pOVar10 + 1;
          iVar9 = iVar13 + 1;
        } while (fVar1 < pOVar10[1].prob);
        lVar15 = (long)right_00 + 1;
        piVar8 = &pOVar2[(long)right_00 + 1].label;
        iVar9 = right_00;
        do {
          right_00 = iVar9;
          piVar14 = piVar8;
          lVar15 = lVar15 + -1;
          piVar8 = piVar14 + -6;
          iVar9 = right_00 + -1;
        } while ((float)piVar14[-5] <= fVar1 && fVar1 != (float)piVar14[-5]);
        if (lVar12 <= lVar15) {
          uVar3 = *(undefined8 *)&pOVar10[1].label;
          *(undefined8 *)&pOVar10[1].label = *(undefined8 *)piVar8;
          uVar4 = *(undefined8 *)&pOVar11->rect;
          uVar5 = *(undefined8 *)&pOVar10[1].rect.width;
          uVar6 = *(undefined8 *)(piVar14 + -10);
          uVar7 = *(undefined8 *)(piVar14 + -8);
          (pOVar11->rect).x = (float)(int)uVar6;
          (pOVar11->rect).y = (float)(int)((ulong)uVar6 >> 0x20);
          pOVar10[1].rect.width = (float)(int)uVar7;
          pOVar10[1].rect.height = (float)(int)((ulong)uVar7 >> 0x20);
          *(undefined8 *)(piVar14 + -10) = uVar4;
          *(undefined8 *)(piVar14 + -8) = uVar5;
          *(undefined8 *)piVar8 = uVar3;
          right_00 = right_00 + -1;
          iVar13 = iVar13 + 1;
        }
      } while (iVar13 <= right_00);
    }
    if (left < right_00) {
      qsort_descent_inplace(objects,left,right_00);
    }
    left = iVar13;
  } while (iVar13 < right);
  return;
}

Assistant:

static void qsort_descent_inplace(std::vector<Object>& objects, int left, int right)
{
    int i = left;
    int j = right;
    float p = objects[(left + right) / 2].prob;

    while (i <= j)
    {
        while (objects[i].prob > p)
            i++;

        while (objects[j].prob < p)
            j--;

        if (i <= j)
        {
            // swap
            std::swap(objects[i], objects[j]);

            i++;
            j--;
        }
    }

    #pragma omp parallel sections
    {
        #pragma omp section
        {
            if (left < j) qsort_descent_inplace(objects, left, j);
        }
        #pragma omp section
        {
            if (i < right) qsort_descent_inplace(objects, i, right);
        }
    }
}